

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O0

QString * QTimeZonePrivate::isoOffsetFormat(int offsetFromUtc,NameType mode)

{
  ulong uVar1;
  int in_EDX;
  uint uVar2;
  int in_ESI;
  QString *in_RDI;
  long in_FS_OFFSET;
  int hour;
  int mins;
  int secs;
  char sign;
  QString *result;
  QString *in_stack_ffffffffffffff78;
  QString *this;
  char local_49;
  int local_44;
  char *local_38 [3];
  char *local_20 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_EDX == 2) && (in_ESI == 0)) {
    utcQString();
  }
  else {
    local_49 = '+';
    local_44 = in_ESI;
    if (in_ESI < 0) {
      local_49 = '-';
      local_44 = -in_ESI;
    }
    uVar2 = local_44 % 0x3c;
    uVar1 = (long)((ulong)(uint)((int)((long)local_44 / 0x3c) >> 0x1f) << 0x20 |
                  (long)local_44 / 0x3c & 0xffffffffU) % 0x3c;
    (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    this = in_RDI;
    QString::asprintf((char **)in_RDI,"UTC%c%02d",(ulong)(uint)(int)local_49,
                      (ulong)(uint)(local_44 / 0xe10));
    if (((in_EDX != 2) || (uVar2 != 0)) || ((int)uVar1 != 0)) {
      QString::asprintf(local_20,":%02d",uVar1 & 0xffffffff);
      QString::operator+=(this,in_stack_ffffffffffffff78);
      QString::~QString((QString *)0x7380f0);
    }
    if ((in_EDX == 1) || (uVar2 != 0)) {
      QString::asprintf(local_38,":%02d",(ulong)uVar2);
      QString::operator+=(this,in_stack_ffffffffffffff78);
      QString::~QString((QString *)0x738169);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QTimeZonePrivate::isoOffsetFormat(int offsetFromUtc, QTimeZone::NameType mode)
{
    if (mode == QTimeZone::ShortName && !offsetFromUtc)
        return utcQString();

    char sign = '+';
    if (offsetFromUtc < 0) {
        sign = '-';
        offsetFromUtc = -offsetFromUtc;
    }
    const int secs = offsetFromUtc % 60;
    const int mins = (offsetFromUtc / 60) % 60;
    const int hour = offsetFromUtc / 3600;
    QString result = QString::asprintf("UTC%c%02d", sign, hour);
    if (mode != QTimeZone::ShortName || secs || mins)
        result += QString::asprintf(":%02d", mins);
    if (mode == QTimeZone::LongName || secs)
        result += QString::asprintf(":%02d", secs);
    return result;
}